

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::Proxy_Function_Base::operator()
          (Proxy_Function_Base *this,Function_Params *params,Type_Conversions_State *t_conversions)

{
  int iVar1;
  size_t sVar2;
  arity_error *this_00;
  undefined8 in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar3;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  Proxy_Function_Base *this_local;
  
  if (-1 < *(int *)&params[2].m_begin) {
    iVar1 = *(int *)&params[2].m_begin;
    sVar2 = Function_Params::size((Function_Params *)t_conversions);
    if ((long)iVar1 != sVar2) {
      this_00 = (arity_error *)__cxa_allocate_exception(0x18);
      sVar2 = Function_Params::size((Function_Params *)t_conversions);
      exception::arity_error::arity_error(this_00,(int)sVar2,*(int *)&params[2].m_begin);
      __cxa_throw(this_00,&exception::arity_error::typeinfo,exception::arity_error::~arity_error);
    }
  }
  (*(code *)params->m_begin[3].m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)(this,params,t_conversions,in_RCX);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value operator()(const Function_Params &params, const chaiscript::Type_Conversions_State &t_conversions) const {
        if (m_arity < 0 || size_t(m_arity) == params.size()) {
          return do_call(params, t_conversions);
        } else {
          throw exception::arity_error(static_cast<int>(params.size()), m_arity);
        }
      }